

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void nn_print_help(nn_parse_context *ctx,FILE *stream)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  size_t extraout_RDX;
  size_t width;
  size_t extraout_RDX_00;
  nn_option *pnVar6;
  char *pcVar7;
  long lVar8;
  
  fwrite("Usage:\n",7,1,(FILE *)stream);
  lVar8 = 0;
  fprintf((FILE *)stream,"    %s ",*ctx->argv);
  bVar1 = true;
  while( true ) {
    if (*(long *)((long)&ctx->options->longname + lVar8) == 0) break;
    if ((*(ulong *)((long)&ctx->options->mask_set + lVar8) & ctx->requires) != 0) {
      pcVar7 = "{--%s";
      if (!bVar1) {
        pcVar7 = "|--%s";
      }
      bVar1 = false;
      fprintf((FILE *)stream,pcVar7);
    }
    lVar8 = lVar8 + 0x58;
  }
  if (!bVar1) {
    fwrite("} ",2,1,(FILE *)stream);
  }
  bVar1 = true;
  lVar8 = 0;
  while( true ) {
    pnVar6 = ctx->options;
    if (*(long *)((long)&pnVar6->longname + lVar8) == 0) break;
    if (((*(ulong *)((long)&pnVar6->mask_set + lVar8) & ctx->requires) == 0) &&
       ((&pnVar6->shortname)[lVar8] != '\0')) {
      iVar2 = nn_has_arg((nn_option *)((long)&pnVar6->longname + lVar8));
      if (iVar2 == 0) {
        if (bVar1) {
          bVar1 = false;
          fprintf((FILE *)stream,"[-%c");
        }
        else {
          fputc((int)(&pnVar6->shortname)[lVar8],(FILE *)stream);
          bVar1 = false;
        }
      }
    }
    lVar8 = lVar8 + 0x58;
  }
  if (!bVar1) {
    fwrite("] ",2,1,(FILE *)stream);
  }
  for (lVar8 = 0; pnVar6 = ctx->options, *(long *)((long)&pnVar6->longname + lVar8) != 0;
      lVar8 = lVar8 + 0x58) {
    if (((*(ulong *)((long)&pnVar6->mask_set + lVar8) & ctx->requires) == 0) &&
       ((&pnVar6->shortname)[lVar8] != '\0')) {
      iVar2 = nn_has_arg((nn_option *)((long)&pnVar6->longname + lVar8));
      if ((iVar2 != 0) && (*(long *)((long)&pnVar6->metavar + lVar8) != 0)) {
        fprintf((FILE *)stream,"[-%c %s] ",(ulong)(uint)(int)(&pnVar6->shortname)[lVar8]);
      }
    }
  }
  fwrite("[options] \n",0xb,1,(FILE *)stream);
  fprintf((FILE *)stream,"\n%s\n",ctx->def->short_description);
  lVar8 = 0;
  pcVar7 = (char *)0x0;
  do {
    pcVar5 = ctx->options[lVar8].longname;
    if (pcVar5 == (char *)0x0) {
      return;
    }
    pnVar6 = ctx->options + lVar8;
    if ((pcVar7 == (char *)0x0) || (pcVar7 != pnVar6->group)) {
LAB_00104d8c:
      fputc(10,(FILE *)stream);
      fprintf((FILE *)stream,"%s:\n",pnVar6->group);
      pcVar5 = pnVar6->longname;
      pcVar7 = pnVar6->group;
    }
    else {
      iVar2 = strcmp(pcVar7,pnVar6->group);
      if (iVar2 != 0) goto LAB_00104d8c;
    }
    fprintf((FILE *)stream," --%s",pcVar5);
    sVar4 = strlen(pnVar6->longname);
    if (pnVar6->shortname == '\0') {
      iVar2 = (int)sVar4 + 3;
    }
    else {
      fprintf((FILE *)stream,",-%c");
      iVar2 = (int)sVar4 + 6;
    }
    iVar3 = nn_has_arg(pnVar6);
    if (iVar3 != 0) {
      if (pnVar6->metavar == (char *)0x0) {
        fwrite(" ARG",4,1,(FILE *)stream);
        iVar2 = iVar2 + 4;
      }
      else {
        fprintf((FILE *)stream," %s");
        sVar4 = strlen(pnVar6->metavar);
        iVar2 = iVar2 + (int)sVar4 + 1;
      }
    }
    if (0x16 < iVar2) {
      pcVar5 = pnVar6->description;
      goto LAB_00104e7d;
    }
    fputs("\n                        " + (long)iVar2 + 1,(FILE *)stream);
    pcVar5 = pnVar6->description;
    width = extraout_RDX;
    while( true ) {
      pcVar5 = nn_print_line(stream,pcVar5,width);
LAB_00104e7d:
      if (*pcVar5 == '\0') break;
      fwrite("\n                        ",0x19,1,(FILE *)stream);
      width = extraout_RDX_00;
    }
    fputc(10,(FILE *)stream);
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

static void nn_print_help (struct nn_parse_context *ctx, FILE *stream)
{
    int i;
    int optlen;
    struct nn_option *opt;
    char *last_group;
    char *cursor;

    fprintf (stream, "Usage:\n");
    nn_print_usage (ctx, stream);
    fprintf (stream, "\n%s\n", ctx->def->short_description);

    last_group = NULL;
    for (i = 0;; ++i) {
        opt = &ctx->options[i];
        if (!opt->longname)
            break;
        if (!last_group || last_group != opt->group ||
            strcmp (last_group, opt->group))
        {
            fprintf (stream, "\n");
            fprintf (stream, "%s:\n", opt->group);
            last_group = opt->group;
        }
        fprintf (stream, " --%s", opt->longname);
        optlen = 3 + strlen (opt->longname);
        if (opt->shortname) {
            fprintf (stream, ",-%c", opt->shortname);
            optlen += 3;
        }
        if (nn_has_arg (opt)) {
            if (opt->metavar) {
                fprintf (stream, " %s", opt->metavar);
                optlen += strlen (opt->metavar) + 1;
            } else {
                fprintf (stream, " ARG");
                optlen += 4;
            }
        }
        if (optlen < 23) {
            fputs (&"                        "[optlen], stream);
            cursor = nn_print_line (stream, opt->description, 80-24);
        } else {
            cursor = opt->description;
        }
        while (*cursor) {
            fprintf (stream, "\n                        ");
            cursor = nn_print_line (stream, cursor, 80-24);
        }
        fprintf (stream, "\n");
    }
}